

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *this_00;
  pointer pcVar4;
  cmLocalNinjaGenerator *this_01;
  pointer pbVar5;
  bool bVar6;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  char **ppcVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *pcVar10;
  long *plVar11;
  string *linkCmd;
  pointer s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string responseFlag;
  string launcher;
  string val;
  string linker;
  cmNinjaRule rule;
  cmRulePlaceholderExpander *local_4a0;
  string *local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  string local_478;
  long *local_458;
  long local_450;
  long local_448 [2];
  string local_438;
  pointer local_418;
  string *local_410;
  undefined8 local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  undefined8 local_3f8;
  size_t local_3f0;
  char *local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  char local_3b0;
  undefined7 uStack_3af;
  undefined1 local_3a0 [32];
  undefined1 *local_380;
  undefined8 local_378;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  char *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  char *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  char *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  bool local_190;
  RuleVariables local_188;
  
  LanguageLinkerDeviceRule(&local_328,this,config);
  local_2b0._0_8_ = local_2b0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == &local_328.field_2) {
    local_2b0._24_8_ = local_328.field_2._8_8_;
  }
  else {
    local_2b0._0_8_ = local_328._M_dataplus._M_p;
  }
  local_290._M_p = (pointer)&local_280;
  local_2b0._8_8_ = local_328._M_string_length;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_288 = 0;
  local_280._M_local_buf[0] = '\0';
  local_270._M_p = (pointer)&local_260;
  local_268 = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  local_230._M_p = (pointer)&local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_210._M_p = (pointer)&local_200;
  local_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_1f0._M_p = (pointer)&local_1e0;
  local_1e8 = (char *)0x0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = (char *)0x0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = (char *)0x0;
  local_1a0._M_local_buf[0] = '\0';
  local_190 = false;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar6 = cmGlobalNinjaGenerator::HasRule(pcVar7,(string *)local_2b0);
  if (!bVar6) {
    memset(&local_188,0,0x158);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_188.CMTargetName = (psVar8->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_188.CMTargetType = (psVar8->_M_dataplus)._M_p;
    local_188.Language = "CUDA";
    pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    paVar1 = &local_438.field_2;
    local_438._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"CUDA","");
    cmGeneratorTarget::GetLinkerTool(&local_308,pcVar3,&local_438,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
    local_188.Linker = local_308._M_dataplus._M_p;
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_438._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_438,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG","");
    psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_438);
    local_458 = local_448;
    pcVar4 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar4,pcVar4 + psVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
    if ((useResponseFile) && (local_450 != 0)) {
      std::__cxx11::string::_M_replace((ulong)&local_1f0,0,local_1e8,0x81170e);
      std::__cxx11::string::_M_append((char *)&local_458,(ulong)local_1f0._M_p);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar10 = "$in_newline";
      if (pcVar7->UsingGCCOnWindows != false) {
        pcVar10 = "$in";
      }
      std::__cxx11::string::_M_replace((ulong)&local_1d0,0,local_1c8,(ulong)pcVar10);
      local_438._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"CUDA","");
      bVar6 = CheckUseResponseFileForLibraries(this,&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != paVar1) {
        operator_delete(local_438._M_dataplus._M_p,
                        (ulong)(local_438.field_2._M_allocated_capacity + 1));
      }
      if (bVar6) {
        std::__cxx11::string::append((char *)&local_1d0);
        local_188.LinkLibraries = "";
      }
      else {
        local_188.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }
      ppcVar9 = &local_188.Objects;
      plVar11 = local_458;
    }
    else {
      ppcVar9 = &local_188.LinkLibraries;
      local_188.Objects = "$in";
      plVar11 = (long *)0x812241;
    }
    *ppcVar9 = (char *)plVar11;
    local_188.ObjectDir = "$OBJECT_DIR";
    local_188.Target = "$TARGET_FILE";
    local_188.SONameFlag = "$SONAME_FLAG";
    local_188.TargetSOName = "$SONAME";
    local_188.TargetPDB = "$TARGET_PDB";
    local_188.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_188.Flags = "$FLAGS";
    local_188.LinkFlags = "$LINK_FLAGS";
    local_188.Manifests = "$MANIFESTS";
    local_188.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";
    local_3c0 = &local_3b0;
    local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_3b0 = '\0';
    pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_438._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"RULE_LAUNCH_LINK","");
    cmLocalGenerator::GetRuleLauncher
              (&local_348,(cmLocalGenerator *)this_01,pcVar3,&local_438,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
    if ((pointer)local_348._M_string_length != (pointer)0x0) {
      local_3a0._0_8_ = local_348._M_string_length;
      local_3a0._8_8_ = local_348._M_dataplus._M_p;
      local_3a0._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_438.field_2._M_allocated_capacity = (long)&local_438.field_2 + 8;
      local_438._M_dataplus._M_p = (pointer)0x0;
      local_438._M_string_length = (size_type)&DAT_00000001;
      local_438.field_2._M_local_buf[8] = 0x20;
      local_3a0._24_8_ = 1;
      local_378 = 0;
      views._M_len = 2;
      views._M_array = (iterator)local_3a0;
      local_380 = (undefined1 *)local_438.field_2._M_allocated_capacity;
      cmCatViews(&local_2e8,views);
      std::__cxx11::string::operator=((string *)&local_3c0,(string *)&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
      }
    }
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_4a0);
    local_498 = config;
    ComputeDeviceLinkCmd_abi_cxx11_(&local_490,this);
    pbVar5 = local_490.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_490.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_490.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_490.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_438._M_dataplus._M_p = (pointer)local_3b8;
        local_438._M_string_length = (size_type)local_3c0;
        local_438.field_2._M_allocated_capacity = 0;
        local_418 = (s->_M_dataplus)._M_p;
        local_438.field_2._8_8_ = s->_M_string_length;
        local_410 = (string *)0x0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_438;
        cmCatViews((string *)local_3a0,views_00);
        std::__cxx11::string::operator=((string *)s,(string *)local_3a0);
        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
          operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_4a0,
                   (cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,s,
                   &local_188);
        s = s + 1;
      } while (s != pbVar5);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmNinjaRemoveNoOpCommands>>
                        (local_490.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_490.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_490,(iterator)__first._M_current,
               (iterator)
               local_490.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_3a0._8_8_ = (char *)0x0;
    local_3a0._16_8_ = local_3a0._16_8_ & 0xffffffffffffff00;
    local_3a0._0_8_ = local_3a0 + 0x10;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_438,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_490,local_498,
               local_498,(string *)local_3a0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_290,(string *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_368,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               local_498);
    pcVar10 = GetVisibleTypeName(this);
    local_438._M_dataplus._M_p = &DAT_00000011;
    local_438._M_string_length = 0x81201f;
    local_438.field_2._M_allocated_capacity = 0;
    local_438.field_2._8_8_ = local_368._M_string_length;
    local_418 = local_368._M_dataplus._M_p;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3a0 + 0x18)
    ;
    local_3a0._0_8_ = (pointer)0x0;
    local_3a0._8_8_ = &DAT_00000001;
    local_3a0[0x18] = 0x20;
    local_408 = 1;
    local_3f8 = 0;
    local_410 = &local_368;
    local_400 = pbVar2;
    local_3a0._16_8_ = pbVar2;
    local_3f0 = strlen(pcVar10);
    local_3e0 = 0;
    local_3d0 = (char *)((long)&local_2e8.field_2 + 8);
    local_2e8._M_dataplus._M_p = (pointer)0x0;
    local_2e8._M_string_length = 1;
    local_2e8.field_2._M_local_buf[8] = '.';
    local_3d8 = 1;
    local_3c8 = 0;
    views_01._M_len = 5;
    views_01._M_array = (iterator)&local_438;
    local_3e8 = pcVar10;
    local_2e8.field_2._M_allocated_capacity = (size_type)local_3d0;
    cmCatViews(&local_478,views_01);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_478,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               local_498);
    pcVar10 = GetVisibleTypeName(this);
    local_438._M_dataplus._M_p = (pointer)0x8;
    local_438._M_string_length = 0x812031;
    local_438.field_2._M_allocated_capacity = 0;
    local_438.field_2._8_8_ = local_478._M_string_length;
    local_418 = local_478._M_dataplus._M_p;
    local_3a0._0_8_ = (pointer)0x0;
    local_3a0._8_8_ = &DAT_00000001;
    local_3a0[0x18] = 0x20;
    local_408 = 1;
    local_3f8 = 0;
    local_410 = &local_478;
    local_400 = pbVar2;
    local_3a0._16_8_ = pbVar2;
    local_3f0 = strlen(pcVar10);
    local_3e0 = 0;
    local_3d8 = 0xd;
    local_3d0 = " $TARGET_FILE";
    local_3c8 = 0;
    views_02._M_len = 5;
    views_02._M_array = (iterator)&local_438;
    local_3e8 = pcVar10;
    cmCatViews(&local_2e8,views_02);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_1b0,0,local_1a8,0x81203a);
    pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_490);
    if (local_4a0 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_4a0->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
    }
    if (local_458 != local_448) {
      operator_delete(local_458,local_448[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_2b0);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";
    std::string linker =
      this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
    vars.Linker = linker.c_str();

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // add the link command in the file if necessary
      if (this->CheckUseResponseFileForLibraries("CUDA")) {
        rule.RspContent += " $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      vars.Objects = responseFlag.c_str();
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}